

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsHie(Abc_Ntk_t *pNtk,int fCollectAll)

{
  ulong uVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    vNodes->pArray = ppvVar5;
    pVVar6 = pNtk->vPos;
    uVar7 = extraout_RDX;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        Abc_NtkDfsHie_rec((Abc_Obj_t *)pVVar6->pArray[lVar9],vNodes);
        lVar9 = lVar9 + 1;
        pVVar6 = pNtk->vPos;
        uVar7 = extraout_RDX_00;
      } while (lVar9 < pVVar6->nSize);
    }
    if ((fCollectAll != 0) && (pVVar6 = pNtk->vObjs, 0 < pVVar6->nSize)) {
      lVar9 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar6->pArray[lVar9];
        if (pNode != (Abc_Obj_t *)0x0) {
          pAVar3 = pNode->pNtk;
          iVar2 = pNode->Id;
          Vec_IntFillExtra(&pAVar3->vTravIds,iVar2 + 1,(int)uVar7);
          if (((long)iVar2 < 0) || ((pAVar3->vTravIds).nSize <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar7 = extraout_RDX_01;
          if ((pAVar3->vTravIds).pArray[iVar2] != pNode->pNtk->nTravIds) {
            Abc_NtkDfs_rec(pNode,vNodes);
            uVar7 = extraout_RDX_02;
          }
        }
        lVar9 = lVar9 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar9 < pVVar6->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsHie( Abc_Ntk_t * pNtk, int fCollectAll )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsHie_rec( pObj, vNodes );
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent(pObj) )
                Abc_NtkDfs_rec( pObj, vNodes );
    }
    return vNodes;
}